

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SplitNDLayerParams::InternalSwap
          (SplitNDLayerParams *this,SplitNDLayerParams *other)

{
  int iVar1;
  int64 iVar2;
  uint64 uVar3;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->splitsizes_,&other->splitsizes_);
  iVar2 = this->axis_;
  this->axis_ = other->axis_;
  other->axis_ = iVar2;
  uVar3 = this->numsplits_;
  this->numsplits_ = other->numsplits_;
  other->numsplits_ = uVar3;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void SplitNDLayerParams::InternalSwap(SplitNDLayerParams* other) {
  splitsizes_.InternalSwap(&other->splitsizes_);
  std::swap(axis_, other->axis_);
  std::swap(numsplits_, other->numsplits_);
  std::swap(_cached_size_, other->_cached_size_);
}